

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O1

ExtPubKeyMap * __thiscall
DescriptorCache::GetCachedLastHardenedExtPubKeys
          (ExtPubKeyMap *__return_storage_ptr__,DescriptorCache *this)

{
  size_t sVar1;
  undefined4 uVar2;
  long in_FS_OFFSET;
  __alloc_node_gen_t __alloc_node_gen;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_int,_CExtPubKey>,_false>_>_>
  local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->_M_h)._M_buckets = (__buckets_ptr)0x0;
  (__return_storage_ptr__->_M_h)._M_bucket_count =
       (this->m_last_hardened_xpubs)._M_h._M_bucket_count;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count =
       (this->m_last_hardened_xpubs)._M_h._M_element_count;
  uVar2 = *(undefined4 *)&(this->m_last_hardened_xpubs)._M_h._M_rehash_policy.field_0x4;
  sVar1 = (this->m_last_hardened_xpubs)._M_h._M_rehash_policy._M_next_resize;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor =
       (this->m_last_hardened_xpubs)._M_h._M_rehash_policy._M_max_load_factor;
  *(undefined4 *)&(__return_storage_ptr__->_M_h)._M_rehash_policy.field_0x4 = uVar2;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = sVar1;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  local_18._M_h = (__hashtable_alloc *)__return_storage_ptr__;
  std::
  _Hashtable<unsigned_int,std::pair<unsigned_int_const,CExtPubKey>,std::allocator<std::pair<unsigned_int_const,CExtPubKey>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_assign<std::_Hashtable<unsigned_int,std::pair<unsigned_int_const,CExtPubKey>,std::allocator<std::pair<unsigned_int_const,CExtPubKey>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<unsigned_int_const,CExtPubKey>,false>>>>
            ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,CExtPubKey>,std::allocator<std::pair<unsigned_int_const,CExtPubKey>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)__return_storage_ptr__,&(this->m_last_hardened_xpubs)._M_h,&local_18);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

ExtPubKeyMap DescriptorCache::GetCachedLastHardenedExtPubKeys() const
{
    return m_last_hardened_xpubs;
}